

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functionals.c
# Opt level: O1

void xc_available_functional_numbers_by_name(int *list)

{
  int iVar1;
  undefined1 auVar2 [16];
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  auVar2 = _DAT_00f6e3b0;
  piVar3 = &xc_functional_keys[0].number;
  lVar7 = 1;
  lVar6 = -0x100000000;
  do {
    lVar6 = lVar6 + 0x100000000;
    lVar7 = lVar7 + -1;
    iVar1 = *piVar3;
    piVar3 = piVar3 + 0x41;
  } while (iVar1 != -1);
  uVar8 = -(int)lVar7;
  if (lVar7 != 0) {
    uVar4 = 1;
    if (1 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    lVar11 = uVar4 - 1;
    auVar9._8_4_ = (int)lVar11;
    auVar9._0_8_ = lVar11;
    auVar9._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar5 = 0;
    auVar9 = auVar9 ^ _DAT_00f6e3b0;
    auVar10 = _DAT_00f6e3a0;
    do {
      auVar12 = auVar10 ^ auVar2;
      if ((bool)(~(auVar12._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar12._0_4_ ||
                  auVar9._4_4_ < auVar12._4_4_) & 1)) {
        list[uVar5] = (int)uVar5;
      }
      if ((auVar12._12_4_ != auVar9._12_4_ || auVar12._8_4_ <= auVar9._8_4_) &&
          auVar12._12_4_ <= auVar9._12_4_) {
        list[uVar5 + 1] = (int)uVar5 + 1;
      }
      uVar5 = uVar5 + 2;
      lVar11 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar11 + 2;
    } while (((int)uVar4 + 1U & 0xfffffffe) != uVar5);
  }
  qsort(list,lVar6 >> 0x20,4,compare_func_names);
  if (lVar7 != 0) {
    uVar4 = 1;
    if (1 < (int)uVar8) {
      uVar4 = (ulong)uVar8;
    }
    uVar5 = 0;
    do {
      list[uVar5] = xc_functional_keys[list[uVar5]].number;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void xc_available_functional_numbers_by_name(int *list)
{
  int ii, N;

  /* Arrange list of functional IDs by name */
  N=xc_number_of_functionals();
  for(ii=0;ii<N;ii++) {
    list[ii]=ii;
  }
  qsort(list, N, sizeof(int), compare_func_names);
  /* Map the internal list to functional IDs */
  for(ii=0;ii<N;ii++){
    list[ii]=xc_functional_keys[list[ii]].number;
  }
}